

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

void tinyformat::detail::FormatArg::formatImpl<unsigned_int>
               (ostream *out,char *fmtBegin,char *fmtEnd,int ntrunc,void *value)

{
  long in_FS_OFFSET;
  char local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (fmtEnd[-1] == 'c') {
    local_9 = *value;
    std::__ostream_insert<char,std::char_traits<char>>(out,&local_9,1);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else if (ntrunc < 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    formatTruncated<unsigned_int>(out,(uint *)value,ntrunc);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TINYFORMAT_HIDDEN static void formatImpl(std::ostream& out, const char* fmtBegin,
                        const char* fmtEnd, int ntrunc, const void* value)
        {
            formatValue(out, fmtBegin, fmtEnd, ntrunc, *static_cast<const T*>(value));
        }